

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_sourcepath(archive_entry *entry)

{
  wchar_t wVar1;
  int *piVar2;
  archive_mstring *in_RDI;
  char *p;
  char **in_stack_ffffffffffffffe8;
  archive *in_stack_fffffffffffffff8;
  
  wVar1 = archive_mstring_get_mbs(in_stack_fffffffffffffff8,in_RDI,in_stack_ffffffffffffffe8);
  if (wVar1 != L'\0') {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(p._4_4_,(char *)in_stack_fffffffffffffff8);
    }
    in_stack_ffffffffffffffe8 = (char **)0x0;
  }
  return (char *)in_stack_ffffffffffffffe8;
}

Assistant:

const char *
archive_entry_sourcepath(struct archive_entry *entry)
{
	const char *p;
	if (archive_mstring_get_mbs(
	    entry->archive, &entry->ae_sourcepath, &p) == 0)
		return (p);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}